

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = flags | 0x100000;
  if ((flags & 0x700000U) != 0) {
    uVar1 = flags;
  }
  uVar2 = uVar1 | 0x800000;
  if ((uVar1 & 0x1800000) != 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 0x2000000;
  if ((uVar2 & 0x6000000) != 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 0x8000000;
  if ((uVar1 & 0x18000000) != 0) {
    uVar2 = uVar1;
  }
  uVar1 = (uVar2 & 0x700000) - 1;
  if ((uVar2 & 0x700000 ^ uVar1) <= uVar1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14e8,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  uVar1 = (uVar2 & 0x1800000) - 1;
  if ((uVar2 & 0x1800000 ^ uVar1) <= uVar1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14e9,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  uVar1 = (uVar2 & 0x6000000) - 1;
  if (uVar1 < (uVar2 & 0x6000000 ^ uVar1)) {
    uVar1 = (uVar2 & 0x18000000) - 1;
    if (uVar1 < (uVar2 & 0x18000000 ^ uVar1)) {
      GImGui->ColorEditOptions = uVar2;
      return;
    }
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x14eb,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                ,0x14ea,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
}

Assistant:

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiColorEditFlags__DisplayMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DisplayMask;
    if ((flags & ImGuiColorEditFlags__DataTypeMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DataTypeMask;
    if ((flags & ImGuiColorEditFlags__PickerMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__PickerMask;
    if ((flags & ImGuiColorEditFlags__InputMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask));    // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask));   // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask));     // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));      // Check only 1 option is selected
    g.ColorEditOptions = flags;
}